

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandReadAiger(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  uint local_3c;
  int c;
  int fCheck;
  char *pFileName;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_3c = 1;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"ch"), iVar1 != -1) {
    if (iVar1 != 99) goto LAB_0039bd9b;
    local_3c = local_3c ^ 1;
  }
  if (argc == globalUtilOptind + 1) {
    pNtk_00 = Io_Read(argv[globalUtilOptind],IO_FILE_AIGER,local_3c,0);
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      pAbc_local._4_4_ = 1;
    }
    else {
      Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_00);
      Abc_FrameClearVerifStatus(pAbc);
      pAbc_local._4_4_ = 0;
    }
  }
  else {
LAB_0039bd9b:
    fprintf((FILE *)pAbc->Err,"usage: read_aiger [-ch] <file>\n");
    fprintf((FILE *)pAbc->Err,
            "\t         reads the network in the AIGER format (http://fmv.jku.at/aiger)\n");
    pcVar2 = "no";
    if (local_3c != 0) {
      pcVar2 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-c     : toggle network check after reading [default = %s]\n",
            pcVar2);
    fprintf((FILE *)pAbc->Err,"\t-h     : prints the command summary\n");
    fprintf((FILE *)pAbc->Err,"\tfile   : the name of a file to read\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandReadAiger( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    char * pFileName;
    int fCheck;
    int c;

    fCheck = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ch" ) ) != EOF )
    {
        switch ( c )
        {
            case 'c':
                fCheck ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // read the file using the corresponding file reader
    pNtk = Io_Read( pFileName, IO_FILE_AIGER, fCheck, 0 );
    if ( pNtk == NULL )
        return 1;
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_aiger [-ch] <file>\n" );
    fprintf( pAbc->Err, "\t         reads the network in the AIGER format (http://fmv.jku.at/aiger)\n" );
    fprintf( pAbc->Err, "\t-c     : toggle network check after reading [default = %s]\n", fCheck? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}